

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O1

void player_know_object(player *p,object *obj)

{
  object *poVar1;
  object *poVar2;
  loc grid;
  char cVar3;
  _Bool _Var4;
  bool bVar5;
  char cVar6;
  int flag;
  _Bool *p_Var7;
  curse_data *pcVar8;
  ego_item *peVar9;
  long lVar10;
  size_t sVar11;
  bitflag bVar12;
  undefined2 uVar13;
  wchar_t wVar14;
  ulong uVar15;
  ulong uVar16;
  char o_name [80];
  char acStack_88 [88];
  
  if (obj == (object *)0x0) {
    return;
  }
  poVar1 = obj->known;
  if (poVar1 == (object *)0x0) {
    return;
  }
  if (obj->kind != poVar1->kind) {
    return;
  }
  if ((obj->kind != (object_kind *)0x0) && ((poVar1->notice & 2) == 0)) {
    object_set_base_known(p,obj);
    return;
  }
  poVar2 = p->obj_k;
  poVar1->dd = poVar2->dd * obj->dd;
  poVar1->ds = poVar2->ds * obj->ds;
  poVar1->ac = poVar2->ac * obj->ac;
  _Var4 = tval_is_chest(obj);
  if (!_Var4) {
    obj->known->pval = obj->pval;
  }
  obj->known->to_a = obj->to_a * p->obj_k->to_a;
  _Var4 = object_has_standard_to_h(obj);
  if (!_Var4) {
    obj->known->to_h = obj->to_h * p->obj_k->to_h;
  }
  poVar1 = p->obj_k;
  poVar2 = obj->known;
  poVar2->to_d = obj->to_d * poVar1->to_d;
  lVar10 = 0x29;
  do {
    if (*(short *)(poVar1->flags + lVar10 * 2 + -0x4c) == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = *(undefined2 *)(obj->flags + lVar10 * 2 + -0x4c);
    }
    *(undefined2 *)(poVar2->flags + lVar10 * 2 + -0x4c) = uVar13;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x3a);
  lVar10 = 0x1d;
  do {
    if (*(short *)(poVar1->flags + lVar10 * 4 + -0x4c) == 1) {
      *(undefined2 *)(poVar2->flags + lVar10 * 4 + -0x4c) =
           *(undefined2 *)(obj->flags + lVar10 * 4 + -0x4c);
      bVar12 = obj->flags[lVar10 * 4 + -0x4a];
    }
    else {
      (poVar2->flags + lVar10 * 4 + -0x4c)[0] = 'd';
      (poVar2->flags + lVar10 * 4 + -0x4c)[1] = '\0';
      bVar12 = '\0';
    }
    poVar2->flags[lVar10 * 4 + -0x4a] = bVar12;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x39);
  flag_wipe(poVar2->flags,6);
  flag = flag_next(p->obj_k->flags,6,1);
  if (flag != 0) {
    do {
      _Var4 = flag_has_dbg(obj->flags,6,flag,"obj->flags","flag");
      if (_Var4) {
        flag_on_dbg(obj->known->flags,6,flag,"obj->known->flags","flag");
      }
      flag = flag_next(p->obj_k->flags,6,flag + 1);
    } while (flag != 0);
  }
  if (obj->kind == (object_kind *)0x0) {
    return;
  }
  if (obj->brands != (_Bool *)0x0) {
    sVar11 = (size_t)z_info->brand_max;
    if (1 < z_info->brand_max) {
      uVar15 = 1;
      bVar5 = false;
      do {
        if ((p->obj_k->brands[uVar15] == true) && (obj->brands[uVar15] == true)) {
          if (obj->known->brands == (_Bool *)0x0) {
            p_Var7 = (_Bool *)mem_zalloc(sVar11);
            obj->known->brands = p_Var7;
          }
          p_Var7 = obj->known->brands;
          _Var4 = true;
          bVar5 = true;
LAB_001a4ec4:
          p_Var7[uVar15] = _Var4;
        }
        else {
          p_Var7 = obj->known->brands;
          if (p_Var7 != (_Bool *)0x0) {
            _Var4 = false;
            goto LAB_001a4ec4;
          }
        }
        uVar15 = uVar15 + 1;
        sVar11 = (size_t)z_info->brand_max;
      } while (uVar15 < sVar11);
      if (bVar5) goto LAB_001a4eff;
    }
    p_Var7 = obj->known->brands;
    if (p_Var7 != (_Bool *)0x0) {
      mem_free(p_Var7);
      obj->known->brands = (_Bool *)0x0;
    }
  }
LAB_001a4eff:
  if (obj->slays != (_Bool *)0x0) {
    sVar11 = (size_t)z_info->slay_max;
    if (1 < z_info->slay_max) {
      uVar15 = 1;
      bVar5 = false;
      do {
        if ((p->obj_k->slays[uVar15] == true) && (obj->slays[uVar15] == true)) {
          if (obj->known->slays == (_Bool *)0x0) {
            p_Var7 = (_Bool *)mem_zalloc(sVar11);
            obj->known->slays = p_Var7;
          }
          p_Var7 = obj->known->slays;
          _Var4 = true;
          bVar5 = true;
LAB_001a4f92:
          p_Var7[uVar15] = _Var4;
        }
        else {
          p_Var7 = obj->known->slays;
          if (p_Var7 != (_Bool *)0x0) {
            _Var4 = false;
            goto LAB_001a4f92;
          }
        }
        uVar15 = uVar15 + 1;
        sVar11 = (size_t)z_info->slay_max;
      } while (uVar15 < sVar11);
      if (bVar5) goto LAB_001a4fcd;
    }
    p_Var7 = obj->known->slays;
    if (p_Var7 != (_Bool *)0x0) {
      mem_free(p_Var7);
      obj->known->slays = (_Bool *)0x0;
    }
  }
LAB_001a4fcd:
  if (obj->curses == (curse_data *)0x0) {
    pcVar8 = obj->known->curses;
    if (pcVar8 != (curse_data *)0x0) goto LAB_001a50a4;
  }
  else {
    uVar15 = (ulong)z_info->curse_max;
    if (1 < z_info->curse_max) {
      uVar16 = 1;
      bVar5 = false;
      do {
        if ((p->obj_k->curses[uVar16].power == L'\0') || (obj->curses[uVar16].power == L'\0')) {
          pcVar8 = obj->known->curses;
          wVar14 = L'\0';
          if (pcVar8 != (curse_data *)0x0) goto LAB_001a506c;
        }
        else {
          if (obj->known->curses == (curse_data *)0x0) {
            pcVar8 = (curse_data *)mem_zalloc((ulong)(uint)((int)uVar15 << 3));
            obj->known->curses = pcVar8;
          }
          wVar14 = obj->curses[uVar16].power;
          pcVar8 = obj->known->curses;
          bVar5 = true;
LAB_001a506c:
          pcVar8[uVar16].power = wVar14;
        }
        uVar16 = uVar16 + 1;
        uVar15 = (ulong)z_info->curse_max;
      } while (uVar16 < uVar15);
      if (bVar5) goto LAB_001a50b8;
    }
    pcVar8 = obj->known->curses;
LAB_001a50a4:
    mem_free(pcVar8);
    obj->known->curses = (curse_data *)0x0;
  }
LAB_001a50b8:
  _Var4 = player_knows_ego(p,obj->ego,obj);
  if (_Var4) {
    peVar9 = obj->ego;
    cVar6 = peVar9->everseen;
  }
  else {
    cVar6 = '\x01';
    peVar9 = (ego_item *)0x0;
  }
  obj->known->ego = peVar9;
  _Var4 = tval_is_jewelry(obj);
  if (_Var4) {
    _Var4 = object_non_curse_runes_known(obj);
    if (!_Var4) goto LAB_001a513a;
    cVar3 = '\x01';
    if (obj->artifact == (artifact *)0x0) {
      cVar3 = obj->kind->everseen;
    }
  }
  else {
    cVar3 = '\x01';
    if (obj->kind->kidx < (uint)z_info->ordinary_kind_max) goto LAB_001a513a;
  }
  cVar6 = cVar3;
  object_flavor_aware(p,obj);
LAB_001a513a:
  if ((((obj->kind->aware == true) && (obj->kind->flavor != (flavor *)0x0)) ||
      ((_Var4 = tval_is_wearable(obj), !_Var4 && (obj->kind->flavor == (flavor *)0x0)))) ||
     (((_Var4 = tval_is_wearable(obj), _Var4 && (obj->kind->effect != (effect *)0x0)) &&
      (obj->kind->aware == true)))) {
    obj->known->effect = obj->effect;
  }
  if (cVar6 == '\0') {
    _Var4 = object_is_carried(p,obj);
    if (_Var4) {
      object_desc(acStack_88,0x50,obj,0x43,p);
      cVar6 = gear_to_label(p,obj);
      msg("You have %s (%c).",acStack_88,(ulong)(uint)(int)cVar6);
    }
    else if ((cave != (chunk_conflict *)0x0) &&
            (grid.x = (p->grid).x, grid.y = (p->grid).y, _Var4 = square_holds_object(cave,grid,obj),
            _Var4)) {
      object_desc(acStack_88,0x50,obj,0x43,p);
      msg("On the ground: %s.",acStack_88);
    }
  }
  _Var4 = object_runes_known(obj);
  if ((_Var4) && (obj->effect == obj->known->effect)) {
    poVar1 = obj->known;
    lVar10 = 0;
    do {
      poVar1->el_info[lVar10].res_level = obj->el_info[lVar10].res_level;
      poVar1->el_info[lVar10].flags = obj->el_info[lVar10].flags;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x1c);
    flag_wipe(obj->known->flags,6);
    flag_copy(obj->known->flags,obj->flags,6);
  }
  return;
}

Assistant:

void player_know_object(struct player *p, struct object *obj)
{
	int i, flag;
	bool seen = true;

	/* Unseen or only sensed objects don't get any ID */
	if (!obj) return;
	if (!obj->known) return;
	if (obj->kind != obj->known->kind) return;

	/* Distant objects just get base properties */
	if (obj->kind && !(obj->known->notice & OBJ_NOTICE_ASSESSED)) {
		object_set_base_known(p, obj);
		return;
	}

	/* Get the dice, and the pval for anything but chests */
	obj->known->dd = obj->dd * p->obj_k->dd;
	obj->known->ds = obj->ds * p->obj_k->ds;
	obj->known->ac = obj->ac * p->obj_k->ac;
	if (!tval_is_chest(obj))
		obj->known->pval = obj->pval;

	/* Set combat details */
	obj->known->to_a = p->obj_k->to_a * obj->to_a;
	if (!object_has_standard_to_h(obj))
		obj->known->to_h = p->obj_k->to_h * obj->to_h;
	obj->known->to_d = p->obj_k->to_d * obj->to_d;

	/* Set modifiers */
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		if (p->obj_k->modifiers[i]) {
			obj->known->modifiers[i] = obj->modifiers[i];
		} else {
			obj->known->modifiers[i] = 0;
		}
	}

	/* Set elements */
	for (i = 0; i < ELEM_MAX; i++) {
		if (p->obj_k->el_info[i].res_level == 1) {
			obj->known->el_info[i].res_level = obj->el_info[i].res_level;
			obj->known->el_info[i].flags = obj->el_info[i].flags;
		} else {
			obj->known->el_info[i].res_level = RES_LEVEL_BASE;
			obj->known->el_info[i].flags = 0;
		}
	}

	/* Set object flags */
	of_wipe(obj->known->flags);
	for (flag = of_next(p->obj_k->flags, FLAG_START); flag != FLAG_END;
		 flag = of_next(p->obj_k->flags, flag + 1)) {
		if (of_has(obj->flags, flag)) {
			of_on(obj->known->flags, flag);
		}
	}

	/* Curse object structures are finished now */
	if (!obj->kind) {
		return;
	}

	/* Set brands */
	if (obj->brands) {
		bool known_brand = false;

		for (i = 1; i < z_info->brand_max; i++) {
			if (player_knows_brand(p, i) && obj->brands[i]) {
				if (!obj->known->brands) {
					obj->known->brands = mem_zalloc(
						z_info->brand_max *
						sizeof(bool));
				}
				obj->known->brands[i] = true;
				known_brand = true;
			} else if (obj->known->brands) {
				obj->known->brands[i] = false;
			}
		}
		if (!known_brand && obj->known->brands) {
			mem_free(obj->known->brands);
			obj->known->brands = NULL;
		}
	}

	/* Set slays */
	if (obj->slays) {
		bool known_slay = false;

		for (i = 1; i < z_info->slay_max; i++) {
			if (player_knows_slay(p, i) && obj->slays[i]) {
				if (!obj->known->slays) {
					obj->known->slays = mem_zalloc(
						z_info->slay_max *
						sizeof(bool));
				}
				obj->known->slays[i] = true;
				known_slay = true;
			} else if (obj->known->slays) {
				obj->known->slays[i] = false;
			}
		}
		if (!known_slay && obj->known->slays) {
			mem_free(obj->known->slays);
			obj->known->slays = NULL;
		}
	}

	/* Set curses - be very careful to keep knowledge aligned */
	if (obj->curses) {
		bool known_cursed = false;
		for (i = 1; i < z_info->curse_max; i++) {
			if (p->obj_k->curses[i].power && obj->curses[i].power) {
				if (!obj->known->curses) {
					obj->known->curses = mem_zalloc(z_info->curse_max *
													sizeof(struct curse_data));
				}
				obj->known->curses[i].power = obj->curses[i].power;
				known_cursed = true;
			} else if (obj->known->curses) {
				obj->known->curses[i].power = 0;
			}
		}
		if (!known_cursed) {
			mem_free(obj->known->curses);
			obj->known->curses = NULL;
		}
	} else if (obj->known->curses) {
		mem_free(obj->known->curses);
		obj->known->curses = NULL;
	}

	/* Set ego type, jewellery type if known */
	if (player_knows_ego(p, obj->ego, obj)) {
		seen = obj->ego->everseen;
		obj->known->ego = obj->ego;
	} else {
		obj->known->ego = NULL;
	}

	if (tval_is_jewelry(obj)) {
		if (object_non_curse_runes_known(obj)) {
			seen = (obj->artifact) ? true : obj->kind->everseen;
			object_flavor_aware(p, obj);
		}
	} else if (obj->kind->kidx >= z_info->ordinary_kind_max) {
		/*
		 * Become aware if it is a special artifact that isn't
		 * jewelry.
		 */
		seen = true;
		object_flavor_aware(p, obj);
	}

	/* Ensure effect is known as if object_set_base_known() had been called. */
	if ((obj->kind->aware && obj->kind->flavor) ||
		(!tval_is_wearable(obj) && !obj->kind->flavor) ||
		(tval_is_wearable(obj) && obj->kind->effect && obj->kind->aware)) {
		obj->known->effect = obj->effect;
	}

	/* Report on new stuff */
	if (!seen) {
		char o_name[80];

		/* Describe the object if it's available */
		if (object_is_carried(p, obj)) {
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, p);
			msg("You have %s (%c).", o_name, gear_to_label(p, obj));
		} else if (cave && square_holds_object(cave, p->grid, obj)) {
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, p);
			msg("On the ground: %s.", o_name);
		}
	}

	/* Fully known objects have their known element and flag info set to 
	 * match the actual info, rather than showing what elements and flags
	 * the would be displaying if they had them */
	if (object_fully_known(obj)) {
		for (i = 0; i < ELEM_MAX; i++) {
			obj->known->el_info[i].res_level = obj->el_info[i].res_level;
			obj->known->el_info[i].flags = obj->el_info[i].flags;
		}
		of_wipe(obj->known->flags);
		of_copy(obj->known->flags, obj->flags);
	}
}